

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O3

void __thiscall Deck::Deck(Deck *this,Deck *toCopy)

{
  int *piVar1;
  vector<CardType,_std::allocator<CardType>_> *this_00;
  vector<CardType,_std::allocator<CardType>_> *pvVar2;
  
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  this->deckSize = piVar1;
  this_00 = (vector<CardType,_std::allocator<CardType>_> *)operator_new(0x18);
  (this_00->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this_00->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this_00->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  this->deckPointer = this_00;
  pvVar2 = (vector<CardType,_std::allocator<CardType>_> *)operator_new(0x18);
  (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->discardPointer = pvVar2;
  *piVar1 = *toCopy->deckSize;
  std::vector<CardType,_std::allocator<CardType>_>::operator=(this_00,toCopy->deckPointer);
  std::vector<CardType,_std::allocator<CardType>_>::operator=
            (this->discardPointer,toCopy->discardPointer);
  return;
}

Assistant:

Deck::Deck(const Deck &toCopy) {
    deckSize = new int();
    deckPointer = new vector<CardType>;
    discardPointer = new vector<CardType>;
    *deckSize = *toCopy.deckSize;
    *deckPointer = *toCopy.deckPointer;
    *discardPointer = *toCopy.discardPointer;
}